

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void GC::CheckBasePointer(char *basePtr)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ExternTypeInfo *elementType;
  
  uVar2 = *(ulong *)(basePtr + -8);
  if ((uVar2 & 2) != 0) {
    __assert_fail("!\"reached a freed pointer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                  ,0x2e5,"void GC::PrintMarker(markerType)");
  }
  if (*(uint *)(NULLC::commonLinker + 0x20c) <= (uint)(uVar2 >> 8)) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,
                  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                 );
  }
  elementType = (ExternTypeInfo *)
                ((uVar2 >> 8 & 0xffffffff) * 0x50 + *(long *)(NULLC::commonLinker + 0x200));
  if ((uVar2 & 0x10) != 0) {
    uVar1._0_1_ = elementType->defaultAlign;
    uVar1._1_1_ = elementType->typeFlags;
    uVar1._2_2_ = elementType->pointerCount;
    uVar3 = 4;
    if (4 < (byte)(undefined1)uVar1) {
      uVar3 = uVar1;
    }
    CheckArrayElements(basePtr + (uVar3 & 0xff),*(uint *)(basePtr + ((ulong)(uVar3 & 0xff) - 4)),
                       elementType);
    return;
  }
  if (elementType->subCat != CAT_NONE) {
    CheckVariable(basePtr,elementType);
    return;
  }
  return;
}

Assistant:

void CheckBasePointer(char* basePtr)
	{
		markerType	*marker = (markerType*)(basePtr - sizeof(markerType));
		PrintMarker(*marker);

		unsigned typeId = unsigned(*marker >> 8);
		const ExternTypeInfo &type = NULLC::commonLinker->exTypes[typeId];

		if(*marker & OBJECT_ARRAY)
		{
			unsigned arrayPadding = type.defaultAlign > 4 ? type.defaultAlign : 4;

			char *elements = basePtr + arrayPadding;

			unsigned size;
			memcpy(&size, elements - sizeof(unsigned), sizeof(unsigned));

			CheckArrayElements(elements, size, type);
		}
		else
		{
			// And if type is not simple, check memory to which pointer points to
			if(type.subCat != ExternTypeInfo::CAT_NONE)
				CheckVariable(basePtr, type);
		}
	}